

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O2

int lws_chunked_html_process(lws_process_html_args *args,lws_process_html_state *s)

{
  char cVar1;
  int iVar2;
  size_t sVar3;
  char *pcVar4;
  size_t __n;
  ulong uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  char *pcVar10;
  ulong uVar11;
  long lVar12;
  char buffer [32];
  
  pcVar4 = args->p;
  iVar8 = args->len;
  args->len = 0;
  s->start = pcVar4;
  pcVar10 = pcVar4;
  do {
    lVar12 = (long)pcVar10 - (long)iVar8;
    while( true ) {
      lVar12 = lVar12 + 1;
      if (pcVar4 + iVar8 <= pcVar10) {
        if (args->chunked == 0) {
          return 0;
        }
        if ((args->final != 0) && (args->max_len <= args->len + 7)) {
          return -1;
        }
        iVar8 = sprintf(buffer,"%X\r\n");
        pcVar4 = args->p;
        sVar3 = (size_t)iVar8;
        args->p = pcVar4 + -sVar3;
        memcpy(pcVar4 + -sVar3,buffer,sVar3);
        iVar8 = args->len;
        lVar12 = (long)iVar8 + sVar3;
        args->len = (int)lVar12;
        iVar7 = args->final;
        pcVar4 = args->p;
        pcVar4[lVar12] = '\r';
        if (iVar7 == 0) {
          pcVar4[lVar12 + 1] = '\n';
          args->len = args->len + 2;
          return 0;
        }
        builtin_strncpy(pcVar4 + (long)iVar8 + sVar3 + 1,"\n0\r\n\r\n",6);
        args->len = args->len + 7;
        return 0;
      }
      if (args->max_len <= args->len + 7) {
        _lws_log(1,"Used up interpret padding\n");
        return -1;
      }
      iVar7 = s->pos;
      if ((long)iVar7 != 0) goto LAB_00134ba0;
      if (*pcVar10 == '$') break;
      args->len = args->len + 1;
      pcVar10 = pcVar10 + 1;
    }
    s->start = pcVar10;
LAB_00134ba0:
    cVar1 = *pcVar10;
    s->pos = iVar7 + 1;
    s->swallow[iVar7] = cVar1;
    iVar7 = s->pos;
    __n = (size_t)iVar7;
    sVar3 = 0xf;
    if (__n == 0xf) {
LAB_00134ca2:
      s->swallow[sVar3] = '\0';
      memcpy(s->start,s->swallow,(long)s->pos);
      args->len = args->len + 1;
      s->pos = 0;
      pcVar10 = s->start;
    }
    else {
      uVar5 = 0;
      uVar11 = (ulong)(uint)s->count_vars;
      if (s->count_vars < 1) {
        uVar11 = uVar5;
      }
      iVar9 = 0;
      iVar6 = 0;
      for (; uVar11 != uVar5; uVar5 = uVar5 + 1) {
        iVar2 = strncmp(s->swallow,s->vars[uVar5],__n);
        if (iVar2 == 0) {
          iVar6 = (int)uVar5;
        }
        iVar9 = iVar9 + (uint)(iVar2 == 0);
      }
      sVar3 = __n;
      if (iVar9 == 0) goto LAB_00134ca2;
      if ((iVar9 == 1) && (sVar3 = strlen(s->vars[iVar6]), iVar7 == (int)sVar3)) {
        pcVar4 = (*s->replace)(s->data,iVar6);
        if (pcVar4 == (char *)0x0) {
          pcVar4 = "NULL";
        }
        sVar3 = strlen(pcVar4);
        s->swallow[s->pos] = '\0';
        iVar7 = (int)sVar3;
        if (s->pos != iVar7) {
          memmove(s->start + iVar7,s->start + s->pos,(long)args->p - lVar12);
          iVar8 = ((iVar8 + iVar7) - s->pos) + 1;
        }
        memcpy(s->start,pcVar4,(long)iVar7);
        args->len = args->len + 1;
        pcVar10 = s->start + 1;
        s->pos = 0;
      }
    }
    pcVar10 = pcVar10 + 1;
    pcVar4 = args->p;
  } while( true );
}

Assistant:

int
lws_chunked_html_process(struct lws_process_html_args *args,
			 struct lws_process_html_state *s)
{
	char *sp, buffer[32];
	const char *pc;
	int old_len, n;

	/* do replacements */
	sp = args->p;
	old_len = args->len;
	args->len = 0;
	s->start = sp;
	while (sp < args->p + old_len) {

		if (args->len + 7 >= args->max_len) {
			lwsl_err("Used up interpret padding\n");
			return -1;
		}

		if ((!s->pos && *sp == '$') || s->pos) {
			int hits = 0, hit = 0;

			if (!s->pos)
				s->start = sp;
			s->swallow[s->pos++] = *sp;
			if (s->pos == sizeof(s->swallow) - 1)
				goto skip;
			for (n = 0; n < s->count_vars; n++)
				if (!strncmp(s->swallow, s->vars[n], s->pos)) {
					hits++;
					hit = n;
				}
			if (!hits) {
skip:
				s->swallow[s->pos] = '\0';
				memcpy(s->start, s->swallow, s->pos);
				args->len++;
				s->pos = 0;
				sp = s->start + 1;
				continue;
			}
			if (hits == 1 && s->pos == (int)strlen(s->vars[hit])) {
				pc = s->replace(s->data, hit);
				if (!pc)
					pc = "NULL";
				n = (int)strlen(pc);
				s->swallow[s->pos] = '\0';
				if (n != s->pos) {
					memmove(s->start + n, s->start + s->pos,
						old_len - (sp - args->p) - 1);
					old_len += (n - s->pos) + 1;
				}
				memcpy(s->start, pc, n);
				args->len++;
				sp = s->start + 1;

				s->pos = 0;
			}
			sp++;
			continue;
		}

		args->len++;
		sp++;
	}

	if (args->chunked) {
		/* no space left for final chunk trailer */
		if (args->final && args->len + 7 >= args->max_len)
			return -1;

		n = sprintf(buffer, "%X\x0d\x0a", args->len);

		args->p -= n;
		memcpy(args->p, buffer, n);
		args->len += n;

		if (args->final) {
			sp = args->p + args->len;
			*sp++ = '\x0d';
			*sp++ = '\x0a';
			*sp++ = '0';
			*sp++ = '\x0d';
			*sp++ = '\x0a';
			*sp++ = '\x0d';
			*sp++ = '\x0a';
			args->len += 7;
		} else {
			sp = args->p + args->len;
			*sp++ = '\x0d';
			*sp++ = '\x0a';
			args->len += 2;
		}
	}

	return 0;
}